

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnncheck.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  rnndb *db_00;
  rnndb *db;
  int ret;
  char **argv_local;
  int argc_local;
  
  rnn_init();
  if (argc < 2) {
    usage();
  }
  db_00 = rnn_newdb();
  rnn_parsefile(db_00,argv[1]);
  rnn_prepdb(db_00);
  iVar1 = db_00->estatus;
  rnn_freedb(db_00);
  rnn_fini();
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
	int ret;
	rnn_init();
	if (argc < 2) {
		usage();
	}
	struct rnndb *db = rnn_newdb();
	rnn_parsefile (db, argv[1]);
	rnn_prepdb (db);

	ret = db->estatus;
	rnn_freedb(db);
	rnn_fini();
	return ret;
}